

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O1

int HaveGarbageAtTheEnd(FILE *out)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  void *pvVar4;
  int unaff_EBP;
  char c;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    iVar3 = __isoc99_fscanf(out,"%c",(long)&uStack_38 + 7);
    bVar1 = false;
    iVar2 = 0;
    if (-1 < iVar3) {
      pvVar4 = memchr(" \t\r\n",(int)uStack_38._7_1_,5);
      bVar1 = true;
      iVar2 = unaff_EBP;
      if (pvVar4 == (void *)0x0) {
        bVar1 = false;
        PrintWithoutBuffering("garbage at the end -- ");
        iVar2 = 1;
      }
    }
    unaff_EBP = iVar2;
  } while (bVar1);
  return unaff_EBP;
}

Assistant:

int HaveGarbageAtTheEnd(FILE* out) {
    while (1) {
        char c;
        int status = fscanf(out, "%c", &c);
        if (status < 0) {
            return 0;
        }
        if (!strchr(" \t\r\n", c)) {
            PrintWithoutBuffering("garbage at the end -- ");
            return 1;
        }
    }
}